

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_serialize_get_reversed(size_t value)

{
  lddmc_ser *plVar1;
  lddmc_ser *ss;
  lddmc_ser s;
  size_t value_local;
  
  value_local = value;
  if (1 < value) {
    s.mdd = value;
    s.assigned = value;
    plVar1 = lddmc_ser_reversed_search(lddmc_ser_reversed_set,(lddmc_ser *)&ss);
    if (plVar1 == (lddmc_ser *)0x0) {
      __assert_fail("ss != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x9d6,"MDD lddmc_serialize_get_reversed(size_t)");
    }
    value_local = plVar1->mdd;
  }
  return value_local;
}

Assistant:

MDD
lddmc_serialize_get_reversed(size_t value)
{
    if ((MDD)value <= lddmc_true) return (MDD)value;
    struct lddmc_ser s, *ss;
    s.assigned = value;
    ss = lddmc_ser_reversed_search(lddmc_ser_reversed_set, &s);
    assert(ss != NULL);
    return ss->mdd;
}